

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

void __thiscall
QSocks5SocketEnginePrivate::setErrorState
          (QSocks5SocketEnginePrivate *this,Socks5State state,QString *extraMessage)

{
  QAbstractSocketEngine *this_00;
  long lVar1;
  SocketError error;
  QArrayDataPointer<char16_t> *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  this_01 = &QStack_68;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketEngine **)&(this->super_QAbstractSocketEnginePrivate).field_0x8;
  switch(state) {
  case Uninitialized:
  case AuthenticationMethodsSent:
  case Authenticating:
  case RequestMethodSent:
  case Connected:
  case UdpAssociateSuccess:
  case BindSuccess:
    goto switchD_0021f01c_caseD_0;
  case ConnectError:
  case ControlSocketError:
    error = QAbstractSocket::error(&this->data->controlSocket->super_QAbstractSocket);
    if (this->socks5State == Connected) {
switchD_0021f0f5_caseD_3:
      QIODevice::errorString();
    }
    else {
      switch(error) {
      case ConnectionRefusedError:
        QSocks5SocketEngine::tr((QString *)&local_50,"Connection to proxy refused",(char *)0x0,-1);
        error = ProxyConnectionRefusedError;
        break;
      case RemoteHostClosedError:
        QSocks5SocketEngine::tr
                  ((QString *)&local_50,"Connection to proxy closed prematurely",(char *)0x0,-1);
        error = ProxyConnectionClosedError;
        break;
      case HostNotFoundError:
        QSocks5SocketEngine::tr((QString *)&local_50,"Proxy host not found",(char *)0x0,-1);
        error = ProxyNotFoundError;
        break;
      default:
        goto switchD_0021f0f5_caseD_3;
      case SocketTimeoutError:
        if (state != ConnectError) goto switchD_0021f0f5_caseD_3;
        QSocks5SocketEngine::tr((QString *)&local_50,"Connection to proxy timed out",(char *)0x0,-1)
        ;
        error = ProxyConnectionTimeoutError;
      }
    }
    break;
  case AuthenticatingError:
    lVar1 = (extraMessage->d).size;
    if (lVar1 == 0) {
      QSocks5SocketEngine::tr((QString *)&local_50,"Proxy authentication failed",(char *)0x0,-1);
    }
    else {
      QSocks5SocketEngine::tr
                ((QString *)&QStack_68,"Proxy authentication failed: %1",(char *)0x0,-1);
      QString::arg<QString,_true>
                ((QString *)&local_50,(QString *)&QStack_68,extraMessage,0,(QChar)0x20);
    }
    QAbstractSocketEngine::setError(this_00,ProxyAuthenticationRequiredError,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    if (lVar1 == 0) goto switchD_0021f01c_caseD_6;
    goto LAB_0021f0a3;
  default:
    goto switchD_0021f01c_caseD_6;
  case SocksError:
    QSocks5SocketEngine::tr((QString *)&local_50,"SOCKS version 5 protocol error",(char *)0x0,-1);
    error = ProxyProtocolError;
    break;
  case HostNameLookupError:
    QAbstractSocket::tr((QString *)&local_50,"Host not found",(char *)0x0,-1);
    error = HostNotFoundError;
  }
  this_01 = &local_50;
  QAbstractSocketEngine::setError(this_00,error,(QString *)this_01);
LAB_0021f0a3:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_01);
switchD_0021f01c_caseD_6:
  QAbstractSocketEngine::setState(this_00,UnconnectedState);
  this->socks5State = state;
switchD_0021f01c_caseD_0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5SocketEnginePrivate::setErrorState(Socks5State state, const QString &extraMessage)
{
    Q_Q(QSocks5SocketEngine);

    switch (state) {
    case Uninitialized:
    case Authenticating:
    case AuthenticationMethodsSent:
    case RequestMethodSent:
    case Connected:
    case UdpAssociateSuccess:
    case BindSuccess:
        // these aren't error states
        return;

    case ConnectError:
    case ControlSocketError: {
        QAbstractSocket::SocketError controlSocketError = data->controlSocket->error();
        if (socks5State != Connected) {
            switch (controlSocketError) {
            case QAbstractSocket::ConnectionRefusedError:
                q->setError(QAbstractSocket::ProxyConnectionRefusedError,
                             QSocks5SocketEngine::tr("Connection to proxy refused"));
                break;
            case QAbstractSocket::RemoteHostClosedError:
                q->setError(QAbstractSocket::ProxyConnectionClosedError,
                             QSocks5SocketEngine::tr("Connection to proxy closed prematurely"));
                break;
            case QAbstractSocket::HostNotFoundError:
                q->setError(QAbstractSocket::ProxyNotFoundError,
                             QSocks5SocketEngine::tr("Proxy host not found"));
                break;
            case QAbstractSocket::SocketTimeoutError:
                if (state == ConnectError) {
                    q->setError(QAbstractSocket::ProxyConnectionTimeoutError,
                                 QSocks5SocketEngine::tr("Connection to proxy timed out"));
                    break;
                }
                Q_FALLTHROUGH();
            default:
                q->setError(controlSocketError, data->controlSocket->errorString());
                break;
            }
        } else {
            q->setError(controlSocketError, data->controlSocket->errorString());
        }
        break;
    }

    case AuthenticatingError:
        q->setError(QAbstractSocket::ProxyAuthenticationRequiredError,
                    extraMessage.isEmpty() ?
                     QSocks5SocketEngine::tr("Proxy authentication failed") :
                     QSocks5SocketEngine::tr("Proxy authentication failed: %1").arg(extraMessage));
        break;

    case RequestError:
        // error code set by caller (overload)
        break;

    case SocksError:
        q->setError(QAbstractSocket::ProxyProtocolError,
                     QSocks5SocketEngine::tr("SOCKS version 5 protocol error"));
        break;

    case HostNameLookupError:
        q->setError(QAbstractSocket::HostNotFoundError,
                    QAbstractSocket::tr("Host not found"));
        break;
    }

    q->setState(QAbstractSocket::UnconnectedState);
    socks5State = state;
}